

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *poVar2;
  pointer pSVar3;
  Colour colourGuard_1;
  SourceLineInfo lineInfo;
  
  if ((this->super_StreamingReporterBase).m_sectionStack.
      super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->super_StreamingReporterBase).m_sectionStack.
      super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    printOpenHeader(this,&((this->super_StreamingReporterBase).currentTestCaseInfo.
                           super_Option<Catch::TestCaseInfo>.nullableValue)->name);
    pSVar3 = (this->super_StreamingReporterBase).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (1 < (ulong)(((long)(this->super_StreamingReporterBase).m_sectionStack.
                           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) / 0x68)) {
      lineInfo.file._M_dataplus._M_p._0_1_ = 0;
      Colour::use(Headers);
      pSVar3 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar1 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      while (pSVar3 = pSVar3 + 1, pSVar3 != pSVar1) {
        printHeaderString(this,&pSVar3->name,2);
      }
      Colour::~Colour((Colour *)&lineInfo);
      pSVar3 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    SourceLineInfo::SourceLineInfo(&lineInfo,&pSVar3->lineInfo);
    if (lineInfo.file._M_string_length != 0) {
      if (getLineOfChars<(char)45>()::line == '\0') {
        uRam000000000016c5c0 = 0x2d2d2d2d2d2d2d;
        uRam000000000016c5c7 = 0x2d2d2d2d2d2d2d2d;
        _DAT_0016c5b0 = 0x2d2d2d2d2d2d2d2d;
        uRam000000000016c5b8 = 0x2d2d2d2d2d2d2d;
        DAT_0016c5bf = 0x2d;
        _DAT_0016c5a0 = 0x2d2d2d2d2d2d2d2d;
        uRam000000000016c5a8 = 0x2d2d2d2d2d2d2d2d;
        _DAT_0016c590 = 0x2d2d2d2d2d2d2d2d;
        uRam000000000016c598 = 0x2d2d2d2d2d2d2d2d;
        _line = 0x2d2d2d2d2d2d2d2d;
        uRam000000000016c588 = 0x2d2d2d2d2d2d2d2d;
        DAT_0016c5cf = 0;
      }
      poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,
                               &getLineOfChars<(char)45>()::line);
      std::operator<<(poVar2,"\n");
      colourGuard_1.m_moved = false;
      Colour::use(FileName);
      poVar2 = (this->super_StreamingReporterBase).stream;
      operator<<(poVar2,&lineInfo);
      std::operator<<(poVar2,"\n");
      Colour::~Colour(&colourGuard_1);
    }
    if (getLineOfChars<(char)46>()::line == '\0') {
      uRam000000000016c610 = 0x2e2e2e2e2e2e2e;
      uRam000000000016c617 = 0x2e2e2e2e2e2e2e2e;
      _DAT_0016c600 = 0x2e2e2e2e2e2e2e2e;
      uRam000000000016c608 = 0x2e2e2e2e2e2e2e;
      DAT_0016c60f = 0x2e;
      _DAT_0016c5f0 = 0x2e2e2e2e2e2e2e2e;
      uRam000000000016c5f8 = 0x2e2e2e2e2e2e2e2e;
      _DAT_0016c5e0 = 0x2e2e2e2e2e2e2e2e;
      uRam000000000016c5e8 = 0x2e2e2e2e2e2e2e2e;
      _line = 0x2e2e2e2e2e2e2e2e;
      uRam000000000016c5d8 = 0x2e2e2e2e2e2e2e2e;
      DAT_0016c61f = 0;
    }
    poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,
                             &getLineOfChars<(char)46>()::line);
    poVar2 = std::operator<<(poVar2,"\n");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&lineInfo);
    return;
  }
  __assert_fail("!m_sectionStack.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AxelStrem[P]local_ptr/test/catch.hpp"
                ,0x2645,"void Catch::ConsoleReporter::printTestCaseAndSectionHeader()");
}

Assistant:

Generic::AllOf<ExpressionT> Matcher<ExpressionT>::operator && ( Matcher<ExpressionT> const& other ) const {
        Generic::AllOf<ExpressionT> allOfExpr;
        allOfExpr.add( *this );
        allOfExpr.add( other );
        return allOfExpr;
    }